

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int x509v3_a2i_ipadd(uint8_t *ipout,char *ipasc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong __n;
  long lVar5;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  int local_2c;
  
  pcVar4 = strchr(ipasc,0x3a);
  if (pcVar4 == (char *)0x0) {
    iVar3 = ipv4_from_asc(ipout,ipasc);
    return iVar3 << 2;
  }
  local_34 = -0x100000000;
  local_2c = 0;
  iVar3 = CONF_parse_list(ipasc,0x3a,0,ipv6_cb,&local_44);
  if (iVar3 == 0) {
    return 0;
  }
  uVar2 = local_34._4_4_;
  __n = (ulong)local_34._4_4_;
  uVar1 = (uint)local_34;
  lVar5 = (long)(int)(uint)local_34;
  if (__n == 0xffffffff) {
    if ((uint)local_34 != 0x10) {
      return 0;
    }
  }
  else {
    if (0xf < (int)(uint)local_34) {
      return 0;
    }
    if (3 < local_2c) {
      return 0;
    }
    if (local_2c == 2) {
      if ((uint)local_34 != local_34._4_4_ && __n != 0) {
        return 0;
      }
    }
    else if (local_2c == 3) {
      if (0 < (int)(uint)local_34) {
        return 0;
      }
    }
    else if ((uint)local_34 == local_34._4_4_ || __n == 0) {
      return 0;
    }
    if (-1 < local_34) {
      if (__n == 0) {
        __n = 0;
      }
      else {
        memcpy(ipout,&local_44,__n);
      }
      memset(ipout + __n,0,(ulong)(0x10 - uVar1));
      if (uVar1 == uVar2) {
        return 0x10;
      }
      memcpy(ipout + __n + (0x10 - lVar5),(void *)((long)&local_44 + __n),(long)(int)(uVar1 - uVar2)
            );
      return 0x10;
    }
  }
  *(undefined8 *)ipout = local_44;
  *(undefined8 *)(ipout + 8) = uStack_3c;
  return 0x10;
}

Assistant:

int x509v3_a2i_ipadd(uint8_t ipout[16], const char *ipasc) {
  // If string contains a ':' assume IPv6

  if (strchr(ipasc, ':')) {
    if (!ipv6_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 16;
  } else {
    if (!ipv4_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 4;
  }
}